

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O3

_Bool build_crossed(chunk *c,loc_conflict centre,wchar_t rating)

{
  chunk *c_00;
  _Bool _Var1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  loc lVar5;
  wchar_t x1;
  wchar_t y2;
  wchar_t y1;
  ulong uVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  wchar_t x2;
  int iVar10;
  wchar_t y2_00;
  wchar_t wVar11;
  wchar_t wVar12;
  bool bVar13;
  wchar_t flag;
  loc local_70;
  wchar_t local_64;
  chunk *local_60;
  wchar_t local_58;
  wchar_t local_54;
  wchar_t local_50;
  wchar_t local_4c;
  wchar_t local_48;
  wchar_t local_44;
  ulong local_40;
  ulong local_38;
  
  wVar8 = c->depth;
  local_70 = (loc)centre;
  uVar2 = Rand_div(0x19);
  iVar3 = rand_range(3,4);
  iVar4 = rand_range(3,0xb);
  wVar11 = iVar3 * 2 + L'\x03';
  if (iVar3 * 2 + 1 < 3) {
    wVar11 = L'\x05';
  }
  wVar7 = iVar4 * 2 + L'\x03';
  if (iVar4 < 2) {
    wVar7 = L'\x05';
  }
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,wVar11,wVar7);
  uVar6 = (ulong)centre >> 0x20;
  if ((c->height <= centre.y) || (c->width <= centre.x)) {
    _Var1 = find_space((loc_conflict *)&local_70,wVar11,wVar7);
    if (!_Var1) {
      return false;
    }
    centre = (loc_conflict)((ulong)local_70 & 0xffffffff);
    uVar6 = (ulong)local_70 >> 0x20;
  }
  iVar10 = (int)uVar6;
  local_38 = (ulong)(uint)(iVar10 - iVar3);
  wVar11 = centre.x;
  x1 = wVar11 + L'\xffffffff';
  local_4c = iVar10 + iVar3;
  local_64 = wVar11 + L'\x01';
  local_44 = iVar10 + L'\xffffffff';
  y2 = iVar10 + L'\x01';
  local_48 = wVar11 + iVar4;
  wVar9 = (iVar10 - iVar3) + L'\xffffffff';
  wVar12 = wVar11 + L'\xfffffffe';
  local_50 = iVar10 + 1 + iVar3;
  x2 = wVar11 + L'\x02';
  wVar8 = (wchar_t)(wVar8 <= uVar2 + L'\x01');
  local_60 = c;
  generate_room(c,wVar9,wVar12,local_50,x2,wVar8);
  c_00 = local_60;
  y1 = iVar10 + L'\xfffffffe';
  local_54 = (wVar11 - iVar4) + L'\xffffffff';
  y2_00 = iVar10 + L'\x02';
  wVar7 = wVar11 + L'\x01' + iVar4;
  local_40 = uVar6;
  generate_room(local_60,y1,local_54,y2_00,wVar7,wVar8);
  local_58 = wVar12;
  draw_rectangle(c_00,wVar9,wVar12,local_50,x2,L'\x15',L'\f',false);
  wVar8 = local_64;
  draw_rectangle(c_00,y1,local_54,y2_00,wVar7,L'\x15',L'\f',false);
  fill_rectangle(c_00,(wchar_t)local_38,x1,local_4c,wVar8,L'\x01',L'\0');
  wVar9 = local_44;
  flag = L'\0';
  wVar12 = L'\x01';
  fill_rectangle(c_00,local_44,wVar11 - iVar4,y2,local_48,L'\x01',L'\0');
  uVar2 = Rand_div(4);
  wVar7 = local_58;
  if (uVar2 == 3) {
    uVar2 = Rand_div(3);
    if (uVar2 == 0) {
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"pinched");
      uVar6 = local_40;
      iVar3 = 1;
      wVar8 = y1;
      do {
        wVar8 = wVar8 + L'\x01';
        bVar13 = iVar3 != 0;
        iVar3 = iVar3 + -1;
        if (bVar13) {
          lVar5 = (loc)loc(wVar7,wVar8);
          square_set_feat((chunk_conflict *)c_00,lVar5,L'\x15');
          generate_mark(c_00,lVar5.y,lVar5.x,lVar5.y,lVar5.x,L'\v');
          lVar5 = (loc)loc(x2,wVar8);
          square_set_feat((chunk_conflict *)c_00,lVar5,L'\x15');
          generate_mark(c_00,lVar5.y,lVar5.x,lVar5.y,lVar5.x,L'\v');
        }
      } while (wVar8 <= (wchar_t)uVar6);
      iVar3 = 1;
      wVar8 = wVar7;
      do {
        wVar8 = wVar8 + L'\x01';
        bVar13 = iVar3 != 0;
        iVar3 = iVar3 + -1;
        if (bVar13) {
          lVar5 = (loc)loc(wVar8,y1);
          square_set_feat((chunk_conflict *)c_00,lVar5,L'\x15');
          generate_mark(c_00,lVar5.y,lVar5.x,lVar5.y,lVar5.x,L'\v');
          lVar5 = (loc)loc(wVar8,y2_00);
          square_set_feat((chunk_conflict *)c_00,lVar5,L'\x15');
          generate_mark(c_00,lVar5.y,lVar5.x,lVar5.y,lVar5.x,L'\v');
        }
      } while (wVar8 <= wVar11);
      uVar2 = Rand_div(3);
      if (uVar2 == 0) {
        iVar4 = (wchar_t)uVar6 * 2 >> 1;
        iVar3 = wVar11 * 2 >> 1;
        lVar5 = (loc)loc(iVar3,y1);
        square_set_feat((chunk_conflict *)c_00,lVar5,L'\x02');
        lVar5 = (loc)loc(wVar7,iVar4);
        square_set_feat((chunk_conflict *)c_00,lVar5,L'\x02');
        lVar5 = (loc)loc(iVar3,y2_00);
        square_set_feat((chunk_conflict *)c_00,lVar5,L'\x02');
        lVar5 = (loc)loc(x2,iVar4);
        square_set_feat((chunk_conflict *)c_00,lVar5,L'\x02');
      }
    }
    else {
      uVar2 = Rand_div(3);
      if (uVar2 == 0) {
        event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"plus");
        generate_plus(c_00,wVar9,x1,y2,local_64,wVar12,flag);
      }
      else {
        uVar2 = Rand_div(3);
        if (uVar2 == 0) {
          event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"pillar");
          lVar5 = local_70;
          square_set_feat((chunk_conflict *)c_00,local_70,L'\x15');
          wVar8 = lVar5.y;
          wVar11 = lVar5.x;
          generate_mark(c_00,wVar8,wVar11,wVar8,wVar11,L'\v');
        }
      }
    }
  }
  else if (uVar2 == 2) {
    event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"inner vault");
    draw_rectangle(c_00,wVar9,x1,y2,wVar8,L'\x15',L'\v',false);
    generate_hole(c_00,wVar9,x1,y2,wVar8,L'\x0f');
    lVar5 = local_70;
    place_object((chunk_conflict *)c_00,(loc_conflict)local_70,c_00->depth,false,false,'\x03',L'\0')
    ;
    wVar8 = c_00->depth;
    uVar2 = Rand_div(2);
    vault_monsters((chunk_conflict *)c_00,(loc_conflict)lVar5,wVar8 + L'\x02',uVar2 + L'\x03');
    uVar2 = Rand_div(3);
    vault_traps((chunk_conflict *)c_00,(loc_conflict)lVar5,L'\x04',L'\x04',uVar2 + L'\x02');
  }
  else {
    if (uVar2 != 1) {
      return true;
    }
    event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"solid middle");
    fill_rectangle(c_00,wVar9,x1,y2,wVar8,L'\x15',L'\v');
  }
  return true;
}

Assistant:

bool build_crossed(struct chunk *c, struct loc centre, int rating)
{
	int y, x;
	int height, width;

	int y1a, x1a, y2a, x2a;
	int y1b, x1b, y2b, x2b;

	int dy, dx, wy, wx;

	int light = false;

	/* Occasional light */
	if (c->depth <= randint1(25)) light = true;

	/* Pick inner dimension */
	wy = 1;
	wx = 1;

	/* Pick outer dimension */
	dy = rand_range(3, 4);
	dx = rand_range(3, 11);

	/* Determine extents of room (a) */
	y1a = dy;
	x1a = wx;
	y2a = dy;
	x2a = wx;

	/* Determine extents of room (b) */
	y1b = wy;
	x1b = dx;
	y2b = wy;
	x2b = dx;

	/* Calculate height and width */
	height = MAX(y1a + y2a + 1, y1b + y2b + 1);
	width = MAX(x1a + x2a + 1, x1b + x2b + 1);

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if (centre.y >= c->height || centre.x >= c->width) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* locate room (b) */
	y1a = centre.y - dy;
	x1a = centre.x - wx;
	y2a = centre.y + dy;
	x2a = centre.x + wx;

	/* locate room (b) */
	y1b = centre.y - wy;
	x1b = centre.x - dx;
	y2b = centre.y + wy;
	x2b = centre.x + dx;

	/* Generate new room (a) */
	generate_room(c, y1a - 1, x1a - 1, y2a + 1, x2a + 1, light);

	/* Generate new room (b) */
	generate_room(c, y1b - 1, x1b - 1, y2b + 1, x2b + 1, light);

	/* Generate outer walls (a) */
	draw_rectangle(c, y1a - 1, x1a - 1, y2a + 1, x2a + 1, 
		FEAT_GRANITE, SQUARE_WALL_OUTER, false);

	/* Generate outer walls (b) */
	draw_rectangle(c, y1b - 1, x1b - 1, y2b + 1, x2b + 1, 
		FEAT_GRANITE, SQUARE_WALL_OUTER, false);

	/* Generate inner floors (a) */
	fill_rectangle(c, y1a, x1a, y2a, x2a, FEAT_FLOOR, SQUARE_NONE);

	/* Generate inner floors (b) */
	fill_rectangle(c, y1b, x1b, y2b, x2b, FEAT_FLOOR, SQUARE_NONE);

	/* Special features */
	switch (randint1(4)) {
		/* Nothing */
	case 1: break;

		/* Large solid middle pillar */
	case 2: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"solid middle");
		fill_rectangle(c, y1b, x1a, y2b, x2a, FEAT_GRANITE, SQUARE_WALL_INNER);
		break;
	}

		/* Inner treasure vault */
	case 3: {
		/* Generate a small inner vault */
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"inner vault");
		draw_rectangle(c, y1b, x1a, y2b, x2a, FEAT_GRANITE,
			SQUARE_WALL_INNER, false);

		/* Open the inner vault with a secret door */
		generate_hole(c, y1b, x1a, y2b, x2a, FEAT_SECRET);

		/* Place a treasure in the vault */
		place_object(c, centre, c->depth, false, false, ORIGIN_SPECIAL, 0);

		/* Let's guard the treasure well */
		vault_monsters(c, centre, c->depth + 2, randint0(2) + 3);

		/* Traps naturally */
		vault_traps(c, centre, 4, 4, randint0(3) + 2);

		break;
	}

		/* Something else */
	case 4: {
		if (one_in_(3)) {
			/* Occasionally pinch the center shut */
			event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
				"pinched");

			/* Pinch the east/west sides */
			for (y = y1b; y <= y2b; y++) {
				if (y == centre.y) continue;
				set_marked_granite(c, loc(x1a - 1, y), SQUARE_WALL_INNER);
				set_marked_granite(c, loc(x2a + 1, y), SQUARE_WALL_INNER);
			}

			/* Pinch the north/south sides */
			for (x = x1a; x <= x2a; x++) {
				if (x == centre.x) continue;
				set_marked_granite(c, loc(x, y1b - 1), SQUARE_WALL_INNER);
				set_marked_granite(c, loc(x, y2b + 1), SQUARE_WALL_INNER);
			}

			/* Open sides with doors */
			if (one_in_(3))
				generate_open(c, y1b - 1, x1a - 1, y2b + 1, x2a + 1,
							  FEAT_CLOSED);

		} else if (one_in_(3)) {
			/* Occasionally put a "plus" in the center */
			event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
				"plus");
			generate_plus(c, y1b, x1a, y2b, x2a, 
						  FEAT_GRANITE, SQUARE_WALL_INNER);

		} else if (one_in_(3)) {
			/* Occasionally put a "pillar" in the center */
			event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
				"pillar");
			set_marked_granite(c, centre, SQUARE_WALL_INNER);
		}

		break;
	}
	}

	return true;
}